

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__
                  ,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  pointer pTVar1;
  pointer pFVar2;
  pointer pFVar3;
  bool bVar4;
  int iVar5;
  pointer __x;
  
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (__return_storage_ptr__,
             ((long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(testCases->
                    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859);
  __x = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pTVar1 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__x == pTVar1) {
      return __return_storage_ptr__;
    }
    pFVar2 = (testSpec->m_filters).
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar3 = (testSpec->m_filters).
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pFVar2 == pFVar3) {
      if (((__x->super_TestCaseInfo).properties & IsHidden) == None) goto LAB_0012d5aa;
      if (pFVar2 != pFVar3) goto LAB_0012d576;
    }
    else {
LAB_0012d576:
      bVar4 = TestSpec::matches(testSpec,&__x->super_TestCaseInfo);
      if ((bVar4) &&
         ((((__x->super_TestCaseInfo).properties & Throws) == None ||
          (iVar5 = (*(config->super_NonCopyable)._vptr_NonCopyable[2])(config), (char)iVar5 != '\0')
          ))) {
LAB_0012d5aa:
        clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                  (__return_storage_ptr__,__x);
      }
    }
    __x = __x + 1;
  } while( true );
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return filtered;
    }